

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O3

void __thiscall PrimeExtractor::PrimeExtractor(PrimeExtractor *this,long stop)

{
  _Bit_type *p_Var1;
  difference_type __n;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this->stop = stop;
  std::vector<bool,_std::allocator<bool>_>::resize(&this->primeCand,stop / 2 + 2,false);
  dVar4 = (double)stop;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar4 = ceil(dVar4);
  this->stopSqrt = (long)dVar4;
  p_Var1 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar3 = ((long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) *
          8 + (ulong)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (uVar3 != 0) {
    uVar2 = 0;
    do {
      p_Var1[uVar2 >> 6] = p_Var1[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar3);
  }
  *(byte *)p_Var1 = (byte)*p_Var1 | 2;
  return;
}

Assistant:

PrimeExtractor::PrimeExtractor(long stop)
{
  /**
   * The internal data structure consists of a vector of booleans.
   * Given a stop count indicating running until reaching this stop. The binary
   * vector size is just half of the stop count - since half of the numbers are
   * even and therefore not prime. So this leads considerung the iterations to
   * the example tables below. Under the title iterateVector are
   * - index within the vector
   * - value of that index
   * natural stands for the number represended by this index.
   * 
   * Init:
   * iterateVector  natural
   *  0    false        1
   *  1    true         3
   *  2    true         5
   *  3    true         7
   *  4    true         9
   *  5    true        11 
   *  6    true        13
   *  7    true        15
   *  8    true        17
   *  9    true        19
   * 10    true        21
   * 11    true        23
   * 12    true        25
   *
   * First interation:
   * findNextStep returns 1 * 2 + 1 = 3
   * iterateVector  natural
   *  0    false        1
   *  1    true         3
   *  2    true         5
   *  3    true         7
   *  4    false        9
   *  5    true        11 
   *  6    true        13
   *  7    false       15
   *  8    true        17
   *  9    true        19
   * 10    false       21
   * 11    true        23
   * 12    true        25
   *
   * Second iteration:
   * findNextStep returns 2 * 2 +1 = 5
   * iterateVector  natural
   *  0    false        1
   *  1    true         3
   *  2    true         5
   *  3    true         7
   *  4    false        9
   *  5    true        11 
   *  6    true        13
   *  7    false       15
   *  8    true        17
   *  9    true        19
   * 10    false       21
   * 11    true        23
   * 12    false       25
   *
   **/
  long stop_limited = stop / 2 + 1;
  
  this->stop = stop ;
  this->primeCand.resize(stop_limited + 1);
  this->stopSqrt = (long)ceil(sqrt(stop));
  for(long i = 0; i < this->primeCand.size()  ; i++) {
    this->primeCand[i] = true;
  }
  this->primeCand[1] = true;
}